

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O2

int BaseSocket::EnumIpAddresses
              (function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
               *fnCallBack,void *vpUser)

{
  int iVar1;
  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  local_30;
  
  std::
  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  ::function(&local_30,fnCallBack);
  iVar1 = BaseSocketImpl::EnumIpAddresses(&local_30,vpUser);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return iVar1;
}

Assistant:

int BaseSocket::EnumIpAddresses(std::function<int(int, const std::string&, int, void*)> fnCallBack, void* vpUser)
{
    return BaseSocketImpl::EnumIpAddresses(fnCallBack, vpUser);
}